

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

size_t tcv_get_vendor_rom_size(tcv_t *tcv)

{
  _Bool _Var1;
  size_t sVar2;
  int local_1c;
  int ret;
  tcv_t *tcv_local;
  
  local_1c = 0;
  _Var1 = tcv_check_and_lock_ok(tcv);
  if (_Var1) {
    _Var1 = tcv_is_initialized(tcv);
    if (_Var1) {
      sVar2 = (*tcv->fun->get_vendor_rom_size)(tcv);
      local_1c = (int)sVar2;
    }
    tcv_unlock(tcv);
    tcv_local = (tcv_t *)(long)local_1c;
  }
  else {
    tcv_local = (tcv_t *)0x0;
  }
  return (size_t)tcv_local;
}

Assistant:

size_t tcv_get_vendor_rom_size(tcv_t *tcv)
{
	int ret = 0;

	if (!tcv_check_and_lock_ok(tcv))
		return 0;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_vendor_rom_size(tcv);
	}

	tcv_unlock(tcv);
	return ret;
}